

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O0

void __thiscall
QSslConfiguration::setCaCertificates(QSslConfiguration *this,QList<QSslCertificate> *certificates)

{
  QSslConfigurationPrivate *pQVar1;
  QList<QSslCertificate> *in_RSI;
  QList<QSslCertificate> *in_stack_ffffffffffffffd8;
  
  QSharedDataPointer<QSslConfigurationPrivate>::operator->
            ((QSharedDataPointer<QSslConfigurationPrivate> *)in_RSI);
  QList<QSslCertificate>::operator=(in_RSI,in_stack_ffffffffffffffd8);
  pQVar1 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                     ((QSharedDataPointer<QSslConfigurationPrivate> *)in_RSI);
  pQVar1->allowRootCertOnDemandLoading = false;
  return;
}

Assistant:

void QSslConfiguration::setCaCertificates(const QList<QSslCertificate> &certificates)
{
    d->caCertificates = certificates;
    d->allowRootCertOnDemandLoading = false;
}